

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O2

int __thiscall
anon_unknown.dwarf_239414::AlsaPlayback::open(AlsaPlayback *this,char *__file,int __oflag,...)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  int iVar3;
  pointer pcVar4;
  backend_exception *this_00;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  vector<DevMap> local_48;
  
  if (__file == (char *)0x0) {
    pcVar4 = GetConfigValue((char *)0x0,"alsa","device","default");
  }
  else {
    if ((anonymous_namespace)::PlaybackDevices == DAT_002294b8) {
      probe_devices(&local_48,SND_PCM_STREAM_PLAYBACK);
      std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
      ::operator=((vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                   *)&(anonymous_namespace)::PlaybackDevices,&local_48);
      std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
      ::~vector(&local_48);
    }
    pbVar1 = DAT_002294b8;
    lVar7 = (long)DAT_002294b8 - (long)(anonymous_namespace)::PlaybackDevices;
    __lhs = (anonymous_namespace)::PlaybackDevices;
    for (lVar5 = lVar7 >> 8; pbVar6 = __lhs, 0 < lVar5; lVar5 = lVar5 + -1) {
      bVar2 = std::operator==(__lhs,__file);
      if (bVar2) goto LAB_0015a517;
      bVar2 = std::operator==(__lhs + 2,__file);
      pbVar6 = __lhs + 2;
      if (bVar2) goto LAB_0015a517;
      bVar2 = std::operator==(__lhs + 4,__file);
      pbVar6 = __lhs + 4;
      if (bVar2) goto LAB_0015a517;
      bVar2 = std::operator==(__lhs + 6,__file);
      pbVar6 = __lhs + 6;
      if (bVar2) goto LAB_0015a517;
      __lhs = __lhs + 8;
      lVar7 = lVar7 + -0x100;
    }
    lVar7 = lVar7 >> 6;
    if (lVar7 == 1) {
LAB_0015a573:
      bVar2 = std::operator==(__lhs,__file);
      pbVar6 = pbVar1;
      if (bVar2) {
        pbVar6 = __lhs;
      }
    }
    else if (lVar7 == 2) {
LAB_0015a4f4:
      bVar2 = std::operator==(pbVar6,__file);
      if (!bVar2) {
        __lhs = pbVar6 + 2;
        goto LAB_0015a573;
      }
    }
    else {
      pbVar6 = pbVar1;
      if ((lVar7 == 3) && (bVar2 = std::operator==(__lhs,__file), pbVar6 = __lhs, !bVar2)) {
        pbVar6 = __lhs + 2;
        goto LAB_0015a4f4;
      }
    }
LAB_0015a517:
    if (pbVar6 == DAT_002294b8) {
      this_00 = (backend_exception *)__cxa_allocate_exception(0x30);
      al::backend_exception::backend_exception(this_00,0xa004,"Device name \"%s\" not found",__file)
      ;
      goto LAB_0015a5f0;
    }
    pcVar4 = pbVar6[1]._M_dataplus._M_p;
  }
  if (2 < (int)gLogLevel) {
    fprintf((FILE *)gLogFile,"[ALSOFT] (II) Opening device \"%s\"\n",pcVar4);
  }
  iVar3 = (*(anonymous_namespace)::psnd_pcm_open)(&this->mPcmHandle,pcVar4,0,1);
  if (-1 < iVar3) {
    (*(anonymous_namespace)::psnd_config_update_free_global)();
    iVar3 = std::__cxx11::string::assign((char *)&((this->super_BackendBase).mDevice)->DeviceName);
    return iVar3;
  }
  this_00 = (backend_exception *)__cxa_allocate_exception(0x30);
  al::backend_exception::backend_exception
            (this_00,0xa005,"Could not open ALSA device \"%s\"",pcVar4);
LAB_0015a5f0:
  __cxa_throw(this_00,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
}

Assistant:

void AlsaPlayback::open(const ALCchar *name)
{
    const char *driver{};
    if(name)
    {
        if(PlaybackDevices.empty())
            PlaybackDevices = probe_devices(SND_PCM_STREAM_PLAYBACK);

        auto iter = std::find_if(PlaybackDevices.cbegin(), PlaybackDevices.cend(),
            [name](const DevMap &entry) -> bool
            { return entry.name == name; }
        );
        if(iter == PlaybackDevices.cend())
            throw al::backend_exception{ALC_INVALID_VALUE, "Device name \"%s\" not found", name};
        driver = iter->device_name.c_str();
    }
    else
    {
        name = alsaDevice;
        driver = GetConfigValue(nullptr, "alsa", "device", "default");
    }

    TRACE("Opening device \"%s\"\n", driver);
    int err{snd_pcm_open(&mPcmHandle, driver, SND_PCM_STREAM_PLAYBACK, SND_PCM_NONBLOCK)};
    if(err < 0)
        throw al::backend_exception{ALC_OUT_OF_MEMORY, "Could not open ALSA device \"%s\"",
            driver};

    /* Free alsa's global config tree. Otherwise valgrind reports a ton of leaks. */
    snd_config_update_free_global();

    mDevice->DeviceName = name;
}